

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_monster_friends_base(parser *p)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  parser_error pVar4;
  void *pvVar5;
  undefined8 *p_00;
  char *pcVar6;
  monster_base *pmVar7;
  undefined4 uVar8;
  random_conflict rVar9;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    p_00 = (undefined8 *)mem_zalloc(0x20);
    rVar9 = parser_getrand(p,"number");
    *(wchar_t *)(p_00 + 3) = rVar9.dice;
    *(wchar_t *)((long)p_00 + 0x1c) = rVar9.sides;
    uVar2 = parser_getuint(p,"chance");
    *(uint *)((long)p_00 + 0x14) = uVar2;
    pcVar6 = parser_getsym(p,"name");
    pmVar7 = lookup_monster_base(pcVar6);
    p_00[1] = pmVar7;
    if (pmVar7 == (monster_base *)0x0) {
      mem_free(p_00);
      pVar4 = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      _Var1 = parser_hasval(p,"role");
      uVar8 = 3;
      if (_Var1) {
        pcVar6 = parser_getsym(p,"role");
        iVar3 = strcmp(pcVar6,"servant");
        if (iVar3 == 0) {
          uVar8 = 1;
        }
        else {
          iVar3 = strcmp(pcVar6,"bodyguard");
          if (iVar3 != 0) {
            mem_free(p_00);
            return PARSE_ERROR_INVALID_MONSTER_ROLE;
          }
          uVar8 = 2;
        }
      }
      *(undefined4 *)(p_00 + 2) = uVar8;
      *p_00 = *(undefined8 *)((long)pvVar5 + 0xb0);
      *(undefined8 **)((long)pvVar5 + 0xb0) = p_00;
      pVar4 = PARSE_ERROR_NONE;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_monster_friends_base(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_friends_base *f;
	struct random number;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	f = mem_zalloc(sizeof *f);
	number = parser_getrand(p, "number");
	f->number_dice = number.dice;
	f->number_side = number.sides;
	f->percent_chance = parser_getuint(p, "chance");
	f->base = lookup_monster_base(parser_getsym(p, "name"));
	if (!f->base) {
		mem_free(f);
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	if (parser_hasval(p, "role")) {
		const char *role_name = parser_getsym(p, "role");
		if (streq(role_name, "servant")) {
			f->role = MON_GROUP_SERVANT;
		} else if (streq(role_name, "bodyguard")) {
			f->role = MON_GROUP_BODYGUARD;
		} else {
			mem_free(f);
			return PARSE_ERROR_INVALID_MONSTER_ROLE;
		}
	} else {
		f->role = MON_GROUP_MEMBER;
	}

	f->next = r->friends_base;
	r->friends_base = f;

	return PARSE_ERROR_NONE;
}